

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O0

string * __thiscall HttpConn::findInBody(string *__return_storage_ptr__,HttpConn *this,string *key)

{
  long lVar1;
  size_t s_idx;
  allocator local_29;
  long local_28;
  size_t idx;
  string *key_local;
  HttpConn *this_local;
  
  idx = (size_t)key;
  key_local = (string *)this;
  this_local = (HttpConn *)__return_storage_ptr__;
  local_28 = std::__cxx11::string::find((string *)&this->requestBody_,(ulong)key);
  if (local_28 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    lVar1 = std::__cxx11::string::size();
    local_28 = lVar1 + 1 + local_28;
    local_28 = std::__cxx11::string::find((char)this + '`',0x26);
    if (local_28 == -1) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->requestBody_);
    }
    else {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&this->requestBody_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HttpConn::findInBody(const std::string& key) {
    size_t idx = requestBody_.find(key);
    if (idx == requestBody_.npos) return "";
    idx += key.size() + 1;
    size_t s_idx = idx;
    idx = requestBody_.find('&', idx);
    if (idx == requestBody_.npos) return requestBody_.substr(s_idx);
    return requestBody_.substr(s_idx, idx - s_idx);
}